

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

void crnlib::Bt2_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  ushort uVar1;
  uint lenLimit;
  ushort *cur;
  UInt32 UVar2;
  
  do {
    lenLimit = p->lenLimit;
    if (lenLimit < 2) {
      MatchFinder_MovePos(p);
    }
    else {
      cur = (ushort *)p->buffer;
      uVar1 = *cur;
      UVar2 = p->hash[uVar1];
      p->hash[uVar1] = p->pos;
      SkipMatchesSpec(lenLimit,UVar2,p->pos,(Byte *)cur,p->son,p->cyclicBufferPos,
                      p->cyclicBufferSize,p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar2 = p->pos + 1;
      p->pos = UVar2;
      if (UVar2 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

static void Bt2_MatchFinder_Skip(CMatchFinder* p, UInt32 num) {
  do {
    SKIP_HEADER(2)
    HASH2_CALC;
    curMatch = p->hash[hashValue];
    p->hash[hashValue] = p->pos;
    SKIP_FOOTER
  } while (--num != 0);
}